

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsCreatePropertyString(char *name,size_t length,JsValueRef *propertyString)

{
  anon_class_24_3_9b2e2c52 fn;
  JsErrorCode JVar1;
  JsValueRef *local_20;
  JsValueRef *propertyString_local;
  size_t length_local;
  char *name_local;
  
  fn.length = (size_t *)&propertyString_local;
  fn.name = (char **)&length_local;
  fn.propertyString = &local_20;
  local_20 = propertyString;
  propertyString_local = (JsValueRef *)length;
  length_local = (size_t)name;
  JVar1 = ContextAPINoScriptWrapper<JsCreatePropertyString::__0>(fn,false,false);
  return JVar1;
}

Assistant:

CHAKRA_API JsCreatePropertyString(
    _In_z_ const char *name,
    _In_ size_t length,
    _Out_ JsValueRef *propertyString)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);
        Js::PropertyRecord* propertyRecord;
        JsErrorCode errorCode = JsCreatePropertyId(name, length, (JsPropertyIdRef *)&propertyRecord);

        if (errorCode != JsNoError)
        {
            return errorCode;
        }

        *propertyString = scriptContext->GetPropertyString(propertyRecord);
        return JsNoError;
    });
}